

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmaxheap.c
# Opt level: O0

int zmaxheap_remove_index(zmaxheap_t *heap,int idx,void *p,float *v)

{
  float fVar1;
  int iVar2;
  int iVar3;
  float local_50;
  float local_4c;
  float right_score;
  float left_score;
  int right;
  int left;
  float parent_score;
  int parent;
  float *v_local;
  void *p_local;
  int idx_local;
  zmaxheap_t *heap_local;
  
  if (idx < heap->size) {
    if (v != (float *)0x0) {
      *v = heap->values[idx];
    }
    if (p != (void *)0x0) {
      memcpy(p,heap->data + (long)idx * heap->el_sz,heap->el_sz);
    }
    heap->size = heap->size + -1;
    if (idx == heap->size) {
      heap_local._4_4_ = 1;
    }
    else {
      heap->values[idx] = heap->values[heap->size];
      memcpy(heap->data + (long)idx * heap->el_sz,heap->data + heap->el_sz * (long)heap->size,
             heap->el_sz);
      fVar1 = heap->values[idx];
      left = idx;
      while (left < heap->size) {
        iVar2 = left * 2 + 1;
        iVar3 = left * 2 + 2;
        if (iVar2 < heap->size) {
          local_4c = heap->values[iVar2];
        }
        else {
          local_4c = -INFINITY;
        }
        if (iVar3 < heap->size) {
          local_50 = heap->values[iVar3];
        }
        else {
          local_50 = -INFINITY;
        }
        if ((local_4c <= fVar1) && (local_50 <= fVar1)) break;
        if (local_4c < local_50) {
          if (heap->size <= iVar3) {
            __assert_fail("right < heap->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zmaxheap.c"
                          ,0xea,"int zmaxheap_remove_index(zmaxheap_t *, int, void *, float *)");
          }
          (*heap->swap)(heap,left,iVar3);
          left = iVar3;
        }
        else {
          if (heap->size <= iVar2) {
            __assert_fail("left < heap->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zmaxheap.c"
                          ,0xe5,"int zmaxheap_remove_index(zmaxheap_t *, int, void *, float *)");
          }
          (*heap->swap)(heap,left,iVar2);
          left = iVar2;
        }
      }
      heap_local._4_4_ = 1;
    }
  }
  else {
    heap_local._4_4_ = 0;
  }
  return heap_local._4_4_;
}

Assistant:

int zmaxheap_remove_index(zmaxheap_t *heap, int idx, void *p, float *v)
{
    if (idx >= heap->size)
        return 0;

    // copy out the requested element from the heap.
    if (v != NULL)
        *v = heap->values[idx];
    if (p != NULL)
        memcpy(p, &heap->data[idx*heap->el_sz], heap->el_sz);

    heap->size--;

    // If this element is already the last one, then there's nothing
    // for us to do.
    if (idx == heap->size)
        return 1;

    // copy last element to first element. (which probably upsets
    // the heap property).
    heap->values[idx] = heap->values[heap->size];
    memcpy(&heap->data[idx*heap->el_sz], &heap->data[heap->el_sz * heap->size], heap->el_sz);

    // now fix the heap. Note, as we descend, we're "pushing down"
    // the same node the entire time. Thus, while the index of the
    // parent might change, the parent_score doesn't.
    int parent = idx;
    float parent_score = heap->values[idx];

    // descend, fixing the heap.
    while (parent < heap->size) {

        int left = 2*parent + 1;
        int right = left + 1;

//            assert(parent_score == heap->values[parent]);

        float left_score = (left < heap->size) ? heap->values[left] : -INFINITY;
        float right_score = (right < heap->size) ? heap->values[right] : -INFINITY;

        // put the biggest of (parent, left, right) as the parent.

        // already okay?
        if (parent_score >= left_score && parent_score >= right_score)
            break;

        // if we got here, then one of the children is bigger than the parent.
        if (left_score >= right_score) {
            assert(left < heap->size);
            heap->swap(heap, parent, left);
            parent = left;
        } else {
            // right_score can't be less than left_score if right_score is -INFINITY.
            assert(right < heap->size);
            heap->swap(heap, parent, right);
            parent = right;
        }
    }

    return 1;
}